

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::throwErrorIfMultidimensionalArray(Context *location,Type *type)

{
  size_t sVar1;
  Category CVar2;
  Structure *pSVar3;
  char (*in_R9) [25];
  Member *m;
  Member *type_00;
  long lVar4;
  Type elementType;
  Type local_68;
  CompileMessage local_50;
  
  CVar2 = type->category;
  if (CVar2 == array) {
    Type::getArrayElementType(&local_68,type);
    if (local_68.category == array) {
      CompileMessageHelpers::createMessage<char_const(&)[25]>
                (&local_50,(CompileMessageHelpers *)0x1,none,0x259aab,"Multi-dimensional arrays",
                 in_R9);
      AST::Context::throwError(location,&local_50,false);
    }
    throwErrorIfMultidimensionalArray(location,&local_68);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_68.structure.object);
    CVar2 = type->category;
  }
  if (CVar2 == structure) {
    pSVar3 = Type::getStructRef(type);
    sVar1 = (pSVar3->members).numActive;
    if (sVar1 != 0) {
      type_00 = (pSVar3->members).items;
      lVar4 = sVar1 << 6;
      do {
        throwErrorIfMultidimensionalArray(location,&type_00->type);
        type_00 = type_00 + 1;
        lVar4 = lVar4 + -0x40;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

static void throwErrorIfMultidimensionalArray (const AST::Context& location, const Type& type)
    {
        if (type.isArray())
        {
            auto elementType = type.getArrayElementType();

            if (elementType.isArray())
                location.throwError (Errors::notYetImplemented ("Multi-dimensional arrays"));

            throwErrorIfMultidimensionalArray (location, elementType);
        }

        if (type.isStruct())
            for (auto& m : type.getStructRef().getMembers())
                throwErrorIfMultidimensionalArray (location, m.type);
    }